

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O3

string * __thiscall
t_dart_generator::get_ttype_class_name_abi_cxx11_
          (string *__return_storage_ptr__,t_dart_generator *this,t_type *ttype)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  int iVar3;
  long *plVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar5;
  size_type *psVar6;
  string named_import;
  string local_60;
  long *local_40;
  long local_38;
  long local_30;
  long lStack_28;
  
  if ((this->super_t_oop_generator).super_t_generator.program_ == ttype->program_) {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    lVar2 = *(long *)CONCAT44(extraout_var,iVar3);
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,lVar2,
               ((long *)CONCAT44(extraout_var,iVar3))[1] + lVar2);
  }
  else {
    find_library_name_abi_cxx11_(&local_60,this,ttype->program_);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x3916e3);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_30 = *plVar5;
      lStack_28 = plVar4[3];
      local_40 = &local_30;
    }
    else {
      local_30 = *plVar5;
      local_40 = (long *)*plVar4;
    }
    local_38 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    paVar1 = &local_60.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,local_40,local_38 + (long)local_40);
    std::__cxx11::string::append((char *)&local_60);
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_60,*(ulong *)CONCAT44(extraout_var_00,iVar3));
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar6) {
      lVar2 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if (local_40 != &local_30) {
      operator_delete(local_40);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string t_dart_generator::get_ttype_class_name(t_type* ttype) {
  if (program_ == ttype->get_program()) {
    return ttype->get_name();
  } else {
    string named_import = "t_" + find_library_name(ttype->get_program());
    return named_import + "." + ttype->get_name();
  }
}